

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irExpression *
build_ir_increxpr(Context_conflict *ctx,MOJOSHADER_astDataType *_dt,int val)

{
  MOJOSHADER_astDataTypeType type_00;
  int elements;
  MOJOSHADER_astDataType *dt_00;
  MOJOSHADER_astDataType *pMVar1;
  MOJOSHADER_irExpression *pMVar2;
  int local_3c;
  int i;
  MOJOSHADER_irConstant *retval;
  int elems;
  MOJOSHADER_astDataTypeType type;
  MOJOSHADER_astDataType *dt;
  int val_local;
  MOJOSHADER_astDataType *_dt_local;
  Context_conflict *ctx_local;
  
  dt_00 = reduce_datatype(ctx,_dt);
  pMVar1 = datatype_base(ctx,dt_00);
  type_00 = pMVar1->type;
  elements = datatype_elems(ctx,dt_00);
  pMVar2 = new_ir_constant(ctx,type_00,elements);
  if (type_00 - MOJOSHADER_AST_DATATYPE_BOOL < 3) {
    for (local_3c = 0; local_3c < elements; local_3c = local_3c + 1) {
      *(int *)((long)pMVar2 + (long)local_3c * 4 + 0x20) = val;
    }
  }
  else {
    if (4 < type_00 - MOJOSHADER_AST_DATATYPE_FLOAT) {
      __assert_fail("0 && \"Semantic analysis should have caught this!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x144e,
                    "MOJOSHADER_irExpression *build_ir_increxpr(Context *, const MOJOSHADER_astDataType *, const int)"
                   );
    }
    for (local_3c = 0; local_3c < elements; local_3c = local_3c + 1) {
      *(float *)((long)pMVar2 + (long)local_3c * 4 + 0x20) = (float)val;
    }
  }
  return pMVar2;
}

Assistant:

static MOJOSHADER_irExpression *build_ir_increxpr(Context *ctx, const MOJOSHADER_astDataType *_dt,
                                                  const int val)
{
    const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, _dt);
    const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
    const int elems = datatype_elems(ctx, dt);
    MOJOSHADER_irConstant *retval = (MOJOSHADER_irConstant *) new_ir_constant(ctx, type, elems);
    int i;

    switch (type)
    {
        case MOJOSHADER_AST_DATATYPE_BOOL:
        case MOJOSHADER_AST_DATATYPE_INT:
        case MOJOSHADER_AST_DATATYPE_UINT:
            for (i = 0; i < elems; i++)
                retval->value.ival[i] = (int) val;
            break;

        case MOJOSHADER_AST_DATATYPE_FLOAT:
        case MOJOSHADER_AST_DATATYPE_FLOAT_SNORM:
        case MOJOSHADER_AST_DATATYPE_FLOAT_UNORM:
        case MOJOSHADER_AST_DATATYPE_HALF:
        case MOJOSHADER_AST_DATATYPE_DOUBLE:
            for (i = 0; i < elems; i++)
                retval->value.fval[i] = (float) val;
            break;

        default:
            assert(0 && "Semantic analysis should have caught this!");
    } // switch

    return (MOJOSHADER_irExpression *) retval;
}